

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_i2c_setSlaveAddress(uint8_t addr)

{
  undefined7 in_register_00000039;
  
  bcm2835_peri_write(bcm2835_bsc1 + 3,(uint32_t)CONCAT71(in_register_00000039,addr));
  return;
}

Assistant:

void bcm2835_i2c_setSlaveAddress(uint8_t addr)
{
    /* Set I2C Device Address */
#ifdef I2C_V1
    volatile uint32_t* paddr = bcm2835_bsc0 + BCM2835_BSC_A/4;
#else	
    volatile uint32_t* paddr = bcm2835_bsc1 + BCM2835_BSC_A/4;
#endif
    bcm2835_peri_write(paddr, addr);
}